

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall
ExprFactoryTest_AddFunctions_Test::~ExprFactoryTest_AddFunctions_Test
          (ExprFactoryTest_AddFunctions_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExprFactoryTest, AddFunctions) {
  mp::ExprFactory factory;
  factory.AddFunctions(1);
  EXPECT_ASSERT(factory.AddFunctions(-1), "invalid size");
  EXPECT_THROW(factory.AddFunctions(std::numeric_limits<int>::max()),
               mp::OverflowError);
  mp::func::Type type = mp::func::NUMERIC;
  EXPECT_ASSERT(factory.DefineFunction(-1, "foo", 0, type), "invalid index");
  EXPECT_ASSERT(factory.DefineFunction(1, "foo", 0, type), "invalid index");
  factory.AddFunctions(1);
  factory.DefineFunction(1, "bar", 0, type);
  factory.DefineFunction(0, "foo", 0, type);
  EXPECT_THROW_MSG(factory.DefineFunction(1, "bar", 0, type),
                   mp::Error, "function 1 is already defined");
}